

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O0

void __thiscall BibIndexer::lintEntry(BibIndexer *this,TSNode *entryNode)

{
  TSNode self;
  initializer_list<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  __l;
  bool bVar1;
  Entry **ppEVar2;
  size_type sVar3;
  optional<Style::Entry_*> oVar4;
  TSTree *in_stack_fffffffffffffc68;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_350;
  allocator<char> local_2e1;
  string local_2e0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_2c0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_2b8;
  undefined1 local_298 [24];
  string local_280;
  allocator<char> local_259;
  string local_258;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218 [8];
  TSNode keyNode;
  undefined1 local_1f0 [7];
  bool foundEntryKey;
  u16string entryKey;
  Entry *entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_140 [8];
  TSNode entryNameNode;
  optional<Style::Entry_*> oentry;
  string local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c0 [8];
  TSNode entryNameNode_1;
  uint32_t local_98;
  bool foundEntryName;
  uint32_t i;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint32_t local_5c;
  undefined1 auStack_58 [4];
  uint32_t childCount;
  vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  observedFields;
  undefined1 local_38 [8];
  u16string entryName;
  TSNode *entryNode_local;
  BibIndexer *this_local;
  
  entryName.field_2._8_8_ = entryNode;
  std::__cxx11::u16string::u16string((u16string *)local_38);
  _auStack_58 = (pointer)0x0;
  observedFields.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  observedFields.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
            *)auStack_58);
  local_88 = *(undefined8 *)entryName.field_2._8_8_;
  uStack_80 = *(undefined8 *)*(undefined1 (*) [24])(entryName.field_2._8_8_ + 8);
  local_78 = *(undefined8 *)(entryName.field_2._8_8_ + 0x10);
  uStack_70 = *(undefined8 *)(entryName.field_2._8_8_ + 0x18);
  self.tree = in_stack_fffffffffffffc68;
  self._0_24_ = *(undefined1 (*) [24])(entryName.field_2._8_8_ + 8);
  local_5c = ts_node_named_child_count(self);
  local_98 = 0;
  entryNameNode_1.tree._7_1_ =
       getEntryName(this,(u16string *)local_38,(TSNode *)entryName.field_2._8_8_,&local_98,local_5c)
  ;
  if ((bool)entryNameNode_1.tree._7_1_) {
    bVar1 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::empty
                      ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                        *)local_38);
    if (bVar1) {
      local_e8 = *(undefined8 *)entryName.field_2._8_8_;
      uStack_e0 = *(undefined8 *)(entryName.field_2._8_8_ + 8);
      local_d8 = *(undefined8 *)(entryName.field_2._8_8_ + 0x10);
      uStack_d0 = *(undefined8 *)(entryName.field_2._8_8_ + 0x18);
      ts_node_child((TSNode *)local_c0,*(TSNode *)entryName.field_2._8_8_,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"No entry name",
                 (allocator<char> *)
                 &oentry.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
                  super__Optional_payload_base<Style::Entry_*>.field_0xf);
      addError(this,(TSNode *)local_c0,MissingEntryName,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &oentry.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
                  super__Optional_payload_base<Style::Entry_*>.field_0xf);
      entryNameNode_1.tree._0_4_ = 1;
    }
    else {
      oVar4 = Style::Style::getEntry(this->style,(u16string *)local_38);
      entryNameNode.tree =
           oVar4.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
           super__Optional_payload_base<Style::Entry_*>._M_payload;
      oentry.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
      super__Optional_payload_base<Style::Entry_*>._M_payload._0_1_ =
           oVar4.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
           super__Optional_payload_base<Style::Entry_*>._M_engaged;
      local_168 = *(undefined8 *)entryName.field_2._8_8_;
      uStack_160 = *(undefined8 *)(entryName.field_2._8_8_ + 8);
      local_158 = *(undefined8 *)(entryName.field_2._8_8_ + 0x10);
      uStack_150 = *(undefined8 *)(entryName.field_2._8_8_ + 0x18);
      ts_node_named_child((TSNode *)local_140,*(TSNode *)entryName.field_2._8_8_,local_98);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&entryNameNode.tree);
      if (bVar1) {
        ppEVar2 = std::optional<Style::Entry_*>::value
                            ((optional<Style::Entry_*> *)&entryNameNode.tree);
        entryKey.field_2._8_8_ = *ppEVar2;
        std::__cxx11::u16string::u16string((u16string *)local_1f0);
        keyNode.tree._7_1_ =
             getEntryKey(this,(u16string *)local_1f0,(TSNode *)entryName.field_2._8_8_,&local_98,
                         local_5c);
        if ((bool)keyNode.tree._7_1_) {
          local_238 = *(undefined8 *)entryName.field_2._8_8_;
          uStack_230 = *(undefined8 *)(entryName.field_2._8_8_ + 8);
          local_228 = *(undefined8 *)(entryName.field_2._8_8_ + 0x10);
          uStack_220 = *(undefined8 *)(entryName.field_2._8_8_ + 0x18);
          ts_node_named_child((TSNode *)local_218,*(TSNode *)entryName.field_2._8_8_,local_98);
          bVar1 = std::__cxx11::
                  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                  empty((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                         *)local_1f0);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_258,"Key is empty",&local_259);
            addWarning(this,(TSNode *)local_140,EmptyKey,&local_258);
            std::__cxx11::string::~string((string *)&local_258);
            std::allocator<char>::~allocator(&local_259);
          }
          else {
            sVar3 = std::
                    unordered_set<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                    ::count(&this->keys,(key_type *)local_1f0);
            if (sVar3 == 0) {
              local_2c0 = &local_2b8;
              std::__cxx11::u16string::u16string
                        ((u16string *)local_2c0,
                         (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                          *)local_1f0);
              local_298._0_8_ = &local_2b8;
              local_298._8_8_ = 1;
              __l._M_len = 1;
              __l._M_array = (iterator)local_298._0_8_;
              std::
              unordered_set<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              ::insert(&this->keys,__l);
              local_350 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                           *)local_298;
              do {
                local_350 = local_350 + -1;
                std::__cxx11::u16string::~u16string((u16string *)local_350);
              } while (local_350 != &local_2b8);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_280,"Duplicate key name",
                         (allocator<char> *)(local_298 + 0x17));
              addWarning(this,(TSNode *)local_218,DuplicateKey,&local_280);
              std::__cxx11::string::~string((string *)&local_280);
              std::allocator<char>::~allocator((allocator<char> *)(local_298 + 0x17));
            }
          }
          bVar1 = hasNonASCIIchar((u16string *)local_1f0);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e0,"Non ASCII characters detected in key",&local_2e1);
            addWarning(this,(TSNode *)local_218,NonASCIIKey,&local_2e0);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::allocator<char>::~allocator(&local_2e1);
          }
          lintFields(this,(TSNode *)entryName.field_2._8_8_,
                     (vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
                      *)auStack_58,&local_98,local_5c);
          bVar1 = std::optional::operator_cast_to_bool((optional *)&entryNameNode.tree);
          if (bVar1) {
            postProcessEntry(this,(TSNode *)local_140,(Entry *)entryKey.field_2._8_8_,
                             (vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
                              *)auStack_58);
          }
          entryNameNode_1.tree._0_4_ = 0;
        }
        else {
          entryNameNode_1.tree._0_4_ = 1;
        }
        std::__cxx11::u16string::~u16string((u16string *)local_1f0);
      }
      else {
        UtfHandler::utf16to8((string *)&entry,&this->utf,(u16string *)local_38);
        std::operator+(&local_1a8,"Entry ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry);
        std::operator+(&local_188,&local_1a8," is unexpected");
        addWarning(this,(TSNode *)local_140,UnknownEntry,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&entry);
        entryNameNode_1.tree._0_4_ = 1;
      }
    }
  }
  else {
    entryNameNode_1.tree._0_4_ = 1;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
             *)auStack_58);
  std::__cxx11::u16string::~u16string((u16string *)local_38);
  return;
}

Assistant:

void BibIndexer::lintEntry (TSNode &entryNode) {
    // TODO: Work out exactly how much gets linted
    //   when missing things such as entry name, key, etc
    //   (currently we give up as soon as one doesn't exist)

    u16string entryName {};

    vector<std::pair<u16string, TSNode>> observedFields {}; // we're likely to have at most 10, so a vector should be better than a map

    uint32_t childCount = ts_node_named_child_count(entryNode);
    uint32_t i = 0;

    bool foundEntryName = getEntryName(entryName, entryNode, i, childCount);
    if (!foundEntryName) return;

    if (entryName.empty()) {
        TSNode entryNameNode = ts_node_child(entryNode, 0);
        addError(entryNameNode, Error::MissingEntryName, "No entry name");
        return;
    }

    std::optional<Style::Entry *> oentry = style->getEntry(entryName);

    TSNode entryNameNode = ts_node_named_child(entryNode, i);

    if (!oentry) {
        addWarning(entryNameNode, Warning::UnknownEntry, "Entry " + utf.utf16to8(entryName) + " is unexpected");
        return;
    }

    Style::Entry &entry = *oentry.value();

    u16string entryKey;
    bool foundEntryKey = getEntryKey(entryKey, entryNode, i, childCount);
    if (!foundEntryKey) return;

    TSNode keyNode = ts_node_named_child(entryNode, i);

    if (entryKey.empty()) {
        addWarning(entryNameNode, Warning::EmptyKey, "Key is empty");
    } else {
        if (keys.count(entryKey) > 0) {
            addWarning(keyNode, Warning::DuplicateKey, "Duplicate key name");
        } else {
            keys.insert({ entryKey });
        }
    }

    if (hasNonASCIIchar(entryKey)) {
        addWarning(keyNode, Warning::NonASCIIKey, "Non ASCII characters detected in key");
    }

    lintFields(entryNode, observedFields, i, childCount);

    if (oentry) {
        postProcessEntry(entryNameNode, entry, observedFields);
    }
}